

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int r1fgkf_(int *ido,int *ip,int *l1,int *idl1,double *cc,double *c1,double *c2,int *in1,double *ch,
           double *ch2,int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  long lVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  double *pdVar25;
  double *pdVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  double *pdVar31;
  double *pdVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  double *pdVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  int iVar47;
  long lVar48;
  ulong uVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  double *pdVar53;
  long lVar54;
  long lVar55;
  int iVar56;
  long lVar57;
  ulong uVar58;
  double *pdVar59;
  long lVar60;
  int iVar61;
  int iVar62;
  long lVar63;
  double *pdVar64;
  long lVar65;
  double *pdVar66;
  bool bVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double *local_190;
  double *local_188;
  double *local_168;
  double *local_160;
  double *local_150;
  double *local_140;
  double *local_110;
  
  iVar1 = *in1;
  lVar37 = (long)iVar1;
  iVar35 = *idl1;
  lVar7 = (long)iVar35;
  lVar22 = (long)~((iVar35 + 1) * iVar1);
  iVar2 = *ido;
  lVar44 = (long)iVar2;
  iVar36 = *l1;
  lVar23 = (long)iVar36;
  iVar19 = (iVar36 + 1) * iVar2 + 1;
  lVar29 = (long)~(iVar19 * iVar1);
  iVar3 = *ip;
  lVar48 = (long)iVar3;
  lVar30 = (long)(~((iVar3 + 1) * iVar2) * iVar1 + -1);
  iVar56 = *in2;
  lVar63 = (long)iVar56;
  lVar8 = (long)~((iVar35 + 1) * iVar56);
  lVar65 = (long)~(iVar19 * iVar56);
  dVar68 = cos(6.283185307179586 / (double)iVar3);
  dVar69 = sin(6.283185307179586 / (double)iVar3);
  iVar19 = *ip;
  lVar24 = (long)iVar19;
  iVar47 = (iVar19 + 1) / 2;
  iVar4 = *ido;
  lVar51 = (long)iVar4;
  iVar5 = (iVar4 + -1) / 2;
  uVar27 = 0;
  if (0 < *idl1) {
    uVar27 = *idl1;
  }
  uVar34 = (ulong)uVar27;
  lVar9 = (long)iVar47;
  lVar10 = (long)(iVar19 + 2);
  if (lVar51 == 1) {
    pdVar11 = c2 + (lVar7 + 1) * lVar37 + lVar22 + 1;
    pdVar17 = ch2 + (lVar7 + 1) * lVar63 + lVar8 + 1;
    uVar49 = uVar34;
    while (bVar67 = uVar49 != 0, uVar49 = uVar49 - 1, bVar67) {
      *pdVar11 = *pdVar17;
      pdVar11 = pdVar11 + lVar37;
      pdVar17 = pdVar17 + lVar63;
    }
  }
  else {
    lVar15 = 2;
    pdVar17 = ch2 + (lVar7 + 1) * lVar63 + lVar8 + 1;
    pdVar11 = c2 + (lVar7 + 1) * lVar37 + lVar22 + 1;
    uVar49 = uVar34;
    while (bVar67 = uVar49 != 0, uVar49 = uVar49 - 1, bVar67) {
      *pdVar17 = *pdVar11;
      pdVar17 = pdVar17 + lVar63;
      pdVar11 = pdVar11 + lVar37;
    }
    uVar27 = *l1;
    uVar49 = 0;
    if (0 < (int)uVar27) {
      uVar49 = (ulong)uVar27;
    }
    lVar33 = (lVar23 * 2 + 1) * lVar44;
    pdVar17 = ch + (lVar33 + 1) * lVar63 + lVar65 + 1;
    lVar39 = lVar23 * lVar44 * lVar63;
    lVar46 = lVar44 * lVar63;
    pdVar11 = c1 + (lVar33 + 1) * lVar37 + lVar29 + 1;
    lVar41 = lVar23 * lVar44 * lVar37;
    lVar50 = lVar44 * lVar37;
    for (; pdVar12 = pdVar11, pdVar31 = pdVar17, uVar58 = uVar49, lVar15 <= lVar24;
        lVar15 = lVar15 + 1) {
      while (uVar58 != 0) {
        *pdVar31 = *pdVar12;
        pdVar12 = pdVar12 + lVar50;
        pdVar31 = pdVar31 + lVar46;
        uVar58 = uVar58 - 1;
      }
      pdVar17 = pdVar17 + lVar39;
      pdVar11 = pdVar11 + lVar41;
    }
    if ((int)uVar27 < iVar5) {
      iVar62 = 0;
      uVar20 = 0;
      if (0 < (int)uVar27) {
        uVar20 = uVar27;
      }
      iVar42 = (iVar36 * 2 + 1) * iVar2 + 2;
      iVar21 = iVar56 * iVar42;
      iVar42 = iVar42 * iVar1;
      local_188 = ch + (lVar33 + 3) * lVar63 + lVar65 + 1;
      local_140 = c1 + (lVar33 + 3) * lVar37 + lVar29 + 1;
      for (lVar15 = 2; lVar15 <= lVar24; lVar15 = lVar15 + 1) {
        pdVar17 = local_140;
        pdVar11 = local_188;
        iVar43 = iVar42;
        iVar6 = iVar21;
        for (uVar49 = 1; uVar49 != uVar20 + 1; uVar49 = uVar49 + 1) {
          pdVar12 = pdVar17;
          pdVar31 = pdVar11;
          iVar28 = iVar6;
          iVar61 = iVar43;
          for (lVar54 = 3; lVar54 <= lVar51; lVar54 = lVar54 + 2) {
            ch[lVar65 + (long)iVar28 + 1] =
                 wa[(long)iVar62 + lVar54 + -3] * c1[lVar29 + (long)iVar61 + 1] +
                 wa[(long)iVar62 + lVar54 + -2] * *pdVar12;
            *pdVar31 = wa[(long)iVar62 + lVar54 + -3] * *pdVar12 -
                       c1[lVar29 + (long)iVar61 + 1] * wa[(long)iVar62 + lVar54 + -2];
            iVar28 = iVar28 + iVar56 * 2;
            iVar61 = iVar61 + iVar1 * 2;
            pdVar31 = pdVar31 + lVar63 * 2;
            pdVar12 = pdVar12 + lVar37 * 2;
          }
          iVar6 = iVar6 + iVar56 * iVar2;
          iVar43 = iVar43 + iVar1 * iVar2;
          pdVar11 = pdVar11 + lVar46;
          pdVar17 = pdVar17 + lVar50;
        }
        iVar62 = iVar62 + iVar4;
        iVar21 = iVar21 + iVar56 * iVar2 * iVar36;
        iVar42 = iVar42 + iVar1 * iVar2 * iVar36;
        local_188 = local_188 + lVar39;
        local_140 = local_140 + lVar41;
      }
    }
    else {
      uVar49 = 0;
      if (0 < (int)uVar27) {
        uVar49 = (ulong)uVar27;
      }
      pdVar17 = c1 + (lVar33 + 3) * lVar37 + lVar29 + 1;
      lVar54 = 0;
      pdVar11 = c1 + (lVar33 + 2) * lVar37 + lVar29 + 1;
      iVar36 = 0;
      for (lVar15 = 2; lVar15 <= lVar24; lVar15 = lVar15 + 1) {
        lVar55 = (long)iVar36;
        lVar57 = lVar54;
        pdVar12 = pdVar11;
        pdVar31 = pdVar17;
        for (lVar60 = 3; lVar60 <= lVar51; lVar60 = lVar60 + 2) {
          lVar45 = 0;
          uVar58 = uVar49;
          lVar52 = lVar57;
          while (bVar67 = uVar58 != 0, uVar58 = uVar58 - 1, bVar67) {
            *(double *)((long)ch + lVar52 + lVar65 * 8 + (lVar33 + 2) * lVar63 * 8 + 8) =
                 wa[lVar55] * *(double *)((long)pdVar12 + lVar45) +
                 wa[lVar55 + 1] * *(double *)((long)pdVar31 + lVar45);
            *(double *)((long)ch + lVar52 + lVar65 * 8 + (lVar33 + 3) * lVar63 * 8 + 8) =
                 wa[lVar55] * *(double *)((long)pdVar31 + lVar45) -
                 *(double *)((long)pdVar12 + lVar45) * wa[lVar55 + 1];
            lVar52 = lVar52 + lVar46 * 8;
            lVar45 = lVar45 + lVar50 * 8;
          }
          lVar57 = lVar57 + lVar63 * 0x10;
          pdVar31 = pdVar31 + lVar37 * 2;
          pdVar12 = pdVar12 + lVar37 * 2;
          lVar55 = lVar55 + 2;
        }
        iVar36 = iVar36 + iVar4;
        lVar54 = lVar54 + lVar39 * 8;
        pdVar17 = pdVar17 + lVar41;
        pdVar11 = pdVar11 + lVar41;
      }
    }
    if (iVar5 < (int)uVar27) {
      uVar49 = (ulong)uVar27;
      if ((int)uVar27 < 1) {
        uVar49 = 0;
      }
      pdVar16 = c1 + (lVar33 + 3) * lVar37 + lVar29 + 1;
      pdVar17 = ch + (lVar33 + 3) * lVar63 + lVar65 + 1;
      pdVar11 = c1 + (lVar33 + 2) * lVar37 + lVar29 + 1;
      pdVar12 = ch + (lVar33 + 2) * lVar63 + lVar65 + 1;
      lVar15 = ((lVar10 + -2) * lVar23 + 1) * lVar44;
      lVar24 = lVar15 + 3;
      pdVar31 = c1 + lVar24 * lVar37 + lVar29 + 1;
      pdVar14 = ch + lVar24 * lVar63 + lVar65 + 1;
      lVar15 = lVar15 + 2;
      pdVar18 = c1 + lVar15 * lVar37 + lVar29 + 1;
      pdVar26 = ch + lVar15 * lVar63 + lVar65 + 1;
      for (lVar24 = 2; lVar24 <= lVar9; lVar24 = lVar24 + 1) {
        pdVar13 = pdVar12;
        pdVar25 = pdVar11;
        pdVar32 = pdVar31;
        pdVar38 = pdVar18;
        pdVar53 = pdVar26;
        pdVar59 = pdVar16;
        pdVar64 = pdVar17;
        pdVar66 = pdVar14;
        for (lVar15 = 3; lVar15 <= lVar51; lVar15 = lVar15 + 2) {
          lVar33 = 0;
          lVar54 = 0;
          uVar58 = uVar49;
          while (bVar67 = uVar58 != 0, uVar58 = uVar58 - 1, bVar67) {
            *(double *)((long)pdVar25 + lVar54) =
                 *(double *)((long)pdVar13 + lVar33) + *(double *)((long)pdVar53 + lVar33);
            *(double *)((long)pdVar38 + lVar54) =
                 *(double *)((long)pdVar64 + lVar33) - *(double *)((long)pdVar66 + lVar33);
            *(double *)((long)pdVar59 + lVar54) =
                 *(double *)((long)pdVar64 + lVar33) + *(double *)((long)pdVar66 + lVar33);
            *(double *)((long)pdVar32 + lVar54) =
                 *(double *)((long)pdVar53 + lVar33) - *(double *)((long)pdVar13 + lVar33);
            lVar54 = lVar54 + lVar50 * 8;
            lVar33 = lVar33 + lVar46 * 8;
          }
          pdVar59 = pdVar59 + lVar37 * 2;
          pdVar64 = pdVar64 + lVar63 * 2;
          pdVar25 = pdVar25 + lVar37 * 2;
          pdVar13 = pdVar13 + lVar63 * 2;
          pdVar32 = pdVar32 + lVar37 * 2;
          pdVar66 = pdVar66 + lVar63 * 2;
          pdVar38 = pdVar38 + lVar37 * 2;
          pdVar53 = pdVar53 + lVar63 * 2;
        }
        pdVar16 = pdVar16 + lVar41;
        pdVar17 = pdVar17 + lVar39;
        pdVar11 = pdVar11 + lVar41;
        pdVar12 = pdVar12 + lVar39;
        pdVar31 = pdVar31 + -lVar41;
        pdVar14 = pdVar14 + -lVar39;
        pdVar18 = pdVar18 + -lVar41;
        pdVar26 = pdVar26 + -lVar39;
      }
    }
    else {
      if ((int)uVar27 < 1) {
        uVar27 = 0;
      }
      pdVar11 = c1 + (lVar33 + 2) * lVar37 + lVar29 + 1;
      pdVar17 = ch + (lVar33 + 2) * lVar63 + lVar65 + 1;
      lVar15 = ((lVar10 + -2) * lVar23 + 1) * lVar44;
      lVar24 = lVar15 + 2;
      pdVar31 = c1 + lVar24 * lVar37 + lVar29 + 1;
      local_190 = ch + lVar24 * lVar63 + lVar65 + 1;
      local_150 = c1 + (lVar33 + 3) * lVar37 + lVar29 + 1;
      pdVar26 = ch + (lVar33 + 3) * lVar63 + lVar65 + 1;
      lVar15 = lVar15 + 3;
      pdVar12 = c1 + lVar15 * lVar37 + lVar29 + 1;
      pdVar18 = ch + lVar15 * lVar63 + lVar65 + 1;
      for (lVar24 = 2; lVar24 <= lVar9; lVar24 = lVar24 + 1) {
        pdVar14 = pdVar17;
        pdVar16 = local_150;
        pdVar13 = local_190;
        pdVar25 = pdVar12;
        pdVar32 = pdVar18;
        pdVar38 = pdVar31;
        pdVar53 = pdVar11;
        pdVar59 = pdVar26;
        for (uVar49 = 1; uVar49 != uVar27 + 1; uVar49 = uVar49 + 1) {
          lVar33 = 0;
          lVar54 = 0;
          for (lVar15 = 3; lVar15 <= lVar51; lVar15 = lVar15 + 2) {
            *(double *)((long)pdVar53 + lVar54) =
                 *(double *)((long)pdVar14 + lVar33) + *(double *)((long)pdVar13 + lVar33);
            *(double *)((long)pdVar38 + lVar54) =
                 *(double *)((long)pdVar59 + lVar33) - *(double *)((long)pdVar32 + lVar33);
            *(double *)((long)pdVar16 + lVar54) =
                 *(double *)((long)pdVar59 + lVar33) + *(double *)((long)pdVar32 + lVar33);
            *(double *)((long)pdVar25 + lVar54) =
                 *(double *)((long)pdVar13 + lVar33) - *(double *)((long)pdVar14 + lVar33);
            lVar54 = lVar54 + lVar37 * 0x10;
            lVar33 = lVar33 + lVar63 * 0x10;
          }
          pdVar53 = pdVar53 + lVar50;
          pdVar14 = pdVar14 + lVar46;
          pdVar38 = pdVar38 + lVar50;
          pdVar13 = pdVar13 + lVar46;
          pdVar16 = pdVar16 + lVar50;
          pdVar59 = pdVar59 + lVar46;
          pdVar25 = pdVar25 + lVar50;
          pdVar32 = pdVar32 + lVar46;
        }
        pdVar11 = pdVar11 + lVar41;
        pdVar17 = pdVar17 + lVar39;
        pdVar31 = pdVar31 + -lVar41;
        local_190 = local_190 + -lVar39;
        local_150 = local_150 + lVar41;
        pdVar26 = pdVar26 + lVar39;
        pdVar12 = pdVar12 + -lVar41;
        pdVar18 = pdVar18 + -lVar39;
      }
    }
  }
  lVar15 = (lVar23 * 2 + 1) * lVar44;
  pdVar17 = c1 + lVar29 + lVar37 * (lVar15 + 1);
  lVar50 = lVar23 * lVar44 * lVar37;
  lVar60 = lVar44 * lVar37;
  lVar54 = (lVar15 + 1) * lVar63;
  pdVar11 = ch + lVar54 + lVar65;
  lVar33 = lVar23 * lVar44 * lVar63;
  lVar41 = lVar44 * lVar63;
  lVar39 = (lVar23 * (lVar10 + -2) + 1) * lVar44;
  pdVar12 = c1 + lVar37 * (lVar39 + 1) + lVar29;
  lVar46 = (lVar39 + 1) * lVar63;
  pdVar31 = ch + lVar46 + lVar65;
  lVar29 = 8;
  for (lVar24 = 2; lVar24 <= lVar9; lVar24 = lVar24 + 1) {
    uVar49 = (ulong)(uint)*l1;
    lVar55 = lVar29;
    lVar57 = lVar29;
    if (*l1 < 1) {
      uVar49 = 0;
    }
    while (bVar67 = uVar49 != 0, uVar49 = uVar49 - 1, bVar67) {
      *(double *)((long)pdVar17 + lVar57) =
           *(double *)((long)pdVar11 + lVar55) + *(double *)((long)pdVar31 + lVar55);
      *(double *)((long)pdVar12 + lVar57) =
           *(double *)((long)pdVar31 + lVar55) - *(double *)((long)pdVar11 + lVar55);
      lVar55 = lVar55 + lVar41 * 8;
      lVar57 = lVar57 + lVar60 * 8;
    }
    pdVar17 = pdVar17 + lVar50;
    pdVar11 = pdVar11 + lVar33;
    pdVar12 = pdVar12 + -lVar50;
    pdVar31 = pdVar31 + -lVar33;
  }
  lVar24 = lVar7 * 2 + 1;
  pdVar17 = ch2 + lVar63 * lVar24 + lVar8;
  pdVar11 = ch2 + ((lVar10 + -2) * lVar7 + 1) * lVar63 + lVar8;
  lVar50 = lVar37 * lVar7;
  dVar70 = 1.0;
  dVar71 = 0.0;
  lVar33 = 8;
  for (lVar29 = 2; lVar29 <= lVar9; lVar29 = lVar29 + 1) {
    dVar72 = dVar69 * dVar70;
    dVar70 = dVar70 * dVar68 + -dVar69 * dVar71;
    dVar71 = dVar71 * dVar68 + dVar72;
    uVar49 = uVar34;
    pdVar12 = c2 + ((long)(iVar19 * iVar35) + 1) * lVar37 + 1;
    lVar55 = lVar33;
    pdVar31 = c2 + ((long)(iVar35 * 2) + 1) * lVar37 + 1;
    pdVar18 = c2 + lVar37 * (lVar7 + 1) + 1;
    while (bVar67 = uVar49 != 0, uVar49 = uVar49 - 1, bVar67) {
      *(double *)((long)pdVar17 + lVar55) = pdVar31[lVar22] * dVar70 + pdVar18[lVar22];
      *(double *)((long)pdVar11 + lVar55) = pdVar12[lVar22] * dVar71;
      pdVar18 = pdVar18 + lVar37;
      pdVar31 = pdVar31 + lVar37;
      lVar55 = lVar55 + lVar63 * 8;
      pdVar12 = pdVar12 + lVar37;
    }
    pdVar12 = c2 + (lVar7 * 3 + 1) * lVar37 + lVar22;
    pdVar31 = c2 + ((lVar10 + -3) * lVar7 + 1) * lVar37 + lVar22;
    dVar72 = dVar70;
    dVar73 = dVar71;
    for (uVar49 = 3; uVar49 != iVar47 + 1; uVar49 = uVar49 + 1) {
      dVar74 = dVar71 * dVar72;
      dVar72 = dVar72 * dVar70 + -dVar71 * dVar73;
      dVar73 = dVar73 * dVar70 + dVar74;
      lVar55 = lVar33;
      lVar57 = lVar33;
      uVar58 = uVar34;
      while (bVar67 = uVar58 != 0, uVar58 = uVar58 - 1, bVar67) {
        *(double *)((long)pdVar17 + lVar55) =
             *(double *)((long)pdVar12 + lVar57) * dVar72 + *(double *)((long)pdVar17 + lVar55);
        *(double *)((long)pdVar11 + lVar55) =
             *(double *)((long)pdVar31 + lVar57) * dVar73 + *(double *)((long)pdVar11 + lVar55);
        lVar57 = lVar57 + lVar37 * 8;
        lVar55 = lVar55 + lVar63 * 8;
      }
      pdVar12 = pdVar12 + lVar50;
      pdVar31 = pdVar31 + -lVar50;
    }
    pdVar17 = pdVar17 + lVar63 * lVar7;
    pdVar11 = pdVar11 + -(lVar63 * lVar7);
  }
  pdVar17 = c2 + lVar24 * lVar37 + lVar22 + 1;
  for (lVar22 = 2; pdVar11 = ch2 + (lVar7 + 1) * lVar63 + lVar8 + 1, pdVar12 = pdVar17,
      uVar49 = uVar34, lVar22 <= lVar9; lVar22 = lVar22 + 1) {
    while (uVar49 != 0) {
      *pdVar11 = *pdVar12 + *pdVar11;
      pdVar11 = pdVar11 + lVar63;
      pdVar12 = pdVar12 + lVar37;
      uVar49 = uVar49 - 1;
    }
    pdVar17 = pdVar17 + lVar50;
  }
  uVar27 = *l1;
  if (iVar4 < (int)uVar27) {
    uVar34 = 0;
    if (0 < (int)uVar27) {
      uVar34 = (ulong)uVar27;
    }
    uVar49 = (ulong)((int)uVar34 + 1);
    iVar35 = 0;
    if (0 < iVar4) {
      iVar35 = iVar4;
    }
    pdVar11 = ch + ((lVar23 + 1) * lVar44 + 1) * lVar63 + lVar65 + 1;
    pdVar17 = cc + ((lVar48 + 1) * lVar44 + 1) * lVar37 + lVar30 + 1;
    for (uVar58 = 1; uVar40 = uVar34, pdVar12 = pdVar17, pdVar31 = pdVar11, uVar58 != iVar35 + 1;
        uVar58 = uVar58 + 1) {
      while (uVar40 != 0) {
        *pdVar12 = *pdVar31;
        uVar40 = uVar40 - 1;
        pdVar12 = pdVar12 + lVar60 * lVar48;
        pdVar31 = pdVar31 + lVar41;
      }
      pdVar11 = pdVar11 + lVar63;
      pdVar17 = pdVar17 + lVar37;
    }
  }
  else {
    uVar20 = 0;
    if (0 < (int)uVar27) {
      uVar20 = uVar27;
    }
    uVar49 = (ulong)(uVar20 + 1);
    pdVar17 = ch + ((lVar23 + 1) * lVar44 + 1) * lVar63 + lVar65 + 1;
    pdVar11 = cc + ((lVar48 + 1) * lVar44 + 1) * lVar37 + lVar30 + 1;
    for (uVar34 = 1; pdVar12 = pdVar11, pdVar31 = pdVar17, uVar58 = (ulong)(iVar4 + 1),
        uVar34 != uVar49; uVar34 = uVar34 + 1) {
      while (uVar58 - 1 != 0) {
        *pdVar12 = *pdVar31;
        pdVar12 = pdVar12 + lVar37;
        pdVar31 = pdVar31 + lVar63;
        uVar58 = uVar58 - 1;
      }
      pdVar17 = pdVar17 + lVar41;
      pdVar11 = pdVar11 + lVar60 * lVar48;
    }
  }
  pdVar17 = ch + lVar54 + 1;
  lVar23 = lVar41 * lVar23;
  lVar8 = (lVar48 + 3) * lVar44;
  lVar22 = lVar30 * 8 + (lVar8 + 1) * lVar37 * 8 + 8;
  lVar29 = lVar60 * lVar48;
  lVar44 = (lVar48 + 2) * lVar44;
  lVar24 = lVar30 * 8 + (lVar51 + lVar44) * lVar37 * 8 + 8;
  pdVar11 = ch + lVar46 + 1;
  for (lVar7 = 2; pdVar12 = pdVar11, pdVar31 = cc, pdVar18 = pdVar17, uVar34 = uVar49,
      lVar7 <= lVar9; lVar7 = lVar7 + 1) {
    while (uVar34 - 1 != 0) {
      *(double *)((long)pdVar31 + lVar24) = pdVar18[lVar65];
      *(double *)((long)pdVar31 + lVar22) = pdVar12[lVar65];
      pdVar12 = pdVar12 + lVar41;
      pdVar31 = pdVar31 + lVar29;
      pdVar18 = pdVar18 + lVar41;
      uVar34 = uVar34 - 1;
    }
    pdVar17 = pdVar17 + lVar23;
    lVar22 = lVar22 + lVar60 * 0x10;
    lVar24 = lVar24 + lVar60 * 0x10;
    pdVar11 = pdVar11 + -lVar23;
  }
  if (iVar4 != 1) {
    if (iVar5 < (int)uVar27) {
      pdVar26 = ch + (lVar15 + 3) * lVar63 + lVar65 + 1;
      pdVar31 = ch + (lVar15 + 2) * lVar63 + lVar65 + 1;
      pdVar14 = ch + (lVar39 + 3) * lVar63 + lVar65 + 1;
      pdVar12 = ch + (lVar39 + 2) * lVar63 + lVar65 + 1;
      iVar35 = (iVar4 + (iVar3 + 2) * iVar2 + -1) * iVar1;
      pdVar18 = cc + lVar30 + ((iVar4 + 2) + lVar44 + -4) * lVar37;
      pdVar17 = cc + lVar30 + (lVar8 + 3) * lVar37;
      pdVar11 = cc + lVar30 + (lVar8 + 2) * lVar37;
      for (lVar7 = 2; lVar7 <= lVar9; lVar7 = lVar7 + 1) {
        pdVar16 = pdVar31;
        pdVar13 = pdVar11;
        pdVar25 = pdVar12;
        pdVar32 = pdVar17;
        pdVar38 = pdVar26;
        pdVar53 = pdVar14;
        pdVar59 = pdVar18;
        iVar36 = iVar35;
        for (lVar8 = 3; lVar8 <= lVar51; lVar8 = lVar8 + 2) {
          lVar22 = 8;
          lVar24 = 0;
          iVar56 = iVar36;
          uVar34 = uVar49;
          while (uVar34 = uVar34 - 1, uVar34 != 0) {
            *(double *)((long)pdVar13 + lVar22) =
                 *(double *)((long)pdVar16 + lVar24) + *(double *)((long)pdVar25 + lVar24);
            *(double *)((long)pdVar59 + lVar22) =
                 *(double *)((long)pdVar16 + lVar24) - *(double *)((long)pdVar25 + lVar24);
            *(double *)((long)pdVar32 + lVar22) =
                 *(double *)((long)pdVar38 + lVar24) + *(double *)((long)pdVar53 + lVar24);
            cc[lVar30 + (long)iVar56 + 1] =
                 *(double *)((long)pdVar53 + lVar24) - *(double *)((long)pdVar38 + lVar24);
            lVar24 = lVar24 + lVar41 * 8;
            iVar56 = iVar56 + iVar2 * iVar3 * iVar1;
            lVar22 = lVar22 + lVar29 * 8;
          }
          pdVar38 = pdVar38 + lVar63 * 2;
          pdVar16 = pdVar16 + lVar63 * 2;
          pdVar53 = pdVar53 + lVar63 * 2;
          pdVar25 = pdVar25 + lVar63 * 2;
          iVar36 = iVar36 + iVar1 * -2;
          pdVar59 = pdVar59 + lVar37 * -2;
          pdVar32 = pdVar32 + lVar37 * 2;
          pdVar13 = pdVar13 + lVar37 * 2;
        }
        pdVar26 = pdVar26 + lVar23;
        pdVar31 = pdVar31 + lVar23;
        pdVar14 = pdVar14 + -lVar23;
        pdVar12 = pdVar12 + -lVar23;
        iVar35 = iVar35 + iVar1 * iVar2 * 2;
        pdVar18 = pdVar18 + lVar60 * 2;
        pdVar17 = pdVar17 + lVar60 * 2;
        pdVar11 = pdVar11 + lVar60 * 2;
      }
    }
    else {
      pdVar11 = ch + (lVar15 + 2) * lVar63 + lVar65 + 1;
      local_160 = ch + (lVar39 + 2) * lVar63 + lVar65 + 1;
      local_168 = cc + lVar30 + (lVar8 + 2) * lVar37 + 1;
      iVar35 = ((iVar3 + 2) * iVar2 + iVar4 + -2) * iVar1;
      pdVar12 = ch + (lVar15 + 3) * lVar63 + lVar65 + 1;
      pdVar31 = ch + (lVar39 + 3) * lVar63 + lVar65 + 1;
      local_110 = cc + lVar30 + ((iVar4 + 2) + lVar44 + -3) * lVar37 + 1;
      pdVar17 = cc + lVar30 + (lVar8 + 3) * lVar37 + 1;
      for (lVar7 = 2; lVar7 <= lVar9; lVar7 = lVar7 + 1) {
        pdVar18 = pdVar17;
        pdVar26 = local_168;
        pdVar14 = pdVar12;
        pdVar16 = pdVar31;
        pdVar13 = pdVar11;
        pdVar25 = local_110;
        pdVar32 = local_160;
        iVar36 = iVar35;
        for (uVar34 = 1; uVar34 != uVar49; uVar34 = uVar34 + 1) {
          lVar22 = 0;
          lVar24 = 0;
          pdVar38 = pdVar25;
          iVar56 = iVar36;
          for (lVar8 = 3; lVar8 <= lVar51; lVar8 = lVar8 + 2) {
            *(double *)((long)pdVar26 + lVar22) =
                 *(double *)((long)pdVar13 + lVar24) + *(double *)((long)pdVar32 + lVar24);
            cc[lVar30 + (long)iVar56 + 1] =
                 *(double *)((long)pdVar13 + lVar24) - *(double *)((long)pdVar32 + lVar24);
            *(double *)((long)pdVar18 + lVar22) =
                 *(double *)((long)pdVar14 + lVar24) + *(double *)((long)pdVar16 + lVar24);
            *pdVar38 = *(double *)((long)pdVar16 + lVar24) - *(double *)((long)pdVar14 + lVar24);
            lVar24 = lVar24 + lVar63 * 0x10;
            lVar22 = lVar22 + lVar37 * 0x10;
            iVar56 = iVar56 + iVar1 * -2;
            pdVar38 = pdVar38 + lVar37 * -2;
          }
          pdVar13 = pdVar13 + lVar41;
          pdVar32 = pdVar32 + lVar41;
          pdVar26 = pdVar26 + lVar29;
          iVar36 = iVar36 + iVar2 * iVar3 * iVar1;
          pdVar25 = pdVar25 + lVar29;
          pdVar14 = pdVar14 + lVar41;
          pdVar16 = pdVar16 + lVar41;
          pdVar18 = pdVar18 + lVar29;
        }
        pdVar11 = pdVar11 + lVar23;
        local_160 = local_160 + -lVar23;
        local_168 = local_168 + lVar60 * 2;
        iVar35 = iVar35 + iVar1 * iVar2 * 2;
        local_110 = local_110 + lVar60 * 2;
        pdVar12 = pdVar12 + lVar23;
        pdVar31 = pdVar31 + -lVar23;
        pdVar17 = pdVar17 + lVar60 * 2;
      }
    }
  }
  return 0;
}

Assistant:

int r1fgkf_(int *ido, int *ip, int *l1, int *
	idl1, fft_real_t *cc, fft_real_t *c1, fft_real_t *c2, int *in1, fft_real_t *ch, fft_real_t *ch2,
	 int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, c1_dim1, c1_dim2, c1_dim3, c1_offset, c2_dim1, c2_dim2,
	     c2_offset, ch2_dim1, ch2_dim2, ch2_offset, i__1, i__2, i__3;

    /* Builtin functions */

    /* Local variables */
     int i__, j, k, l, j2, ic, jc, lc, ik, is;
     fft_real_t dc2, ai1, ai2, ar1, ar2, ds2;
     int nbd;
     fft_real_t dcp, arg, dsp, tpi, ar1h, ar2h;
     int idp2, ipp2, idij, ipph;


    /* Parameter adjustments */
    --wa;
    c2_dim1 = *in1;
    c2_dim2 = *idl1;
    c2_offset = 1 + c2_dim1 * (1 + c2_dim2);
    c2 -= c2_offset;
    c1_dim1 = *in1;
    c1_dim2 = *ido;
    c1_dim3 = *l1;
    c1_offset = 1 + c1_dim1 * (1 + c1_dim2 * (1 + c1_dim3));
    c1 -= c1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch2_dim1 = *in2;
    ch2_dim2 = *idl1;
    ch2_offset = 1 + ch2_dim1 * (1 + ch2_dim2);
    ch2 -= ch2_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_dim3 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    tpi = atan(1.0) * 8.0;
    arg = tpi / (fft_real_t) (*ip);
    dcp = cos(arg);
    dsp = sin(arg);
    ipph = (*ip + 1) / 2;
    ipp2 = *ip + 2;
    idp2 = *ido + 2;
    nbd = (*ido - 1) / 2;
    if (*ido == 1) {
	goto L119;
    }
    i__1 = *idl1;
    for (ik = 1; ik <= i__1; ++ik) {
	ch2[(ik + ch2_dim2) * ch2_dim1 + 1] = c2[(ik + c2_dim2) * c2_dim1 + 1]
		;
/* L101: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[((k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = c1[((k + j *
		     c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1];
/* L102: */
	}
/* L103: */
    }
    if (nbd > *l1) {
	goto L107;
    }
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	idij = is;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    idij += 2;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			wa[idij - 1] * c1[(i__ - 1 + (k + j * c1_dim3) *
			c1_dim2) * c1_dim1 + 1] + wa[idij] * c1[(i__ + (k + j
			* c1_dim3) * c1_dim2) * c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = wa[
			idij - 1] * c1[(i__ + (k + j * c1_dim3) * c1_dim2) *
			c1_dim1 + 1] - wa[idij] * c1[(i__ - 1 + (k + j *
			c1_dim3) * c1_dim2) * c1_dim1 + 1];
/* L104: */
	    }
/* L105: */
	}
/* L106: */
    }
    goto L111;
L107:
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    idij = is;
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		idij += 2;
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			wa[idij - 1] * c1[(i__ - 1 + (k + j * c1_dim3) *
			c1_dim2) * c1_dim1 + 1] + wa[idij] * c1[(i__ + (k + j
			* c1_dim3) * c1_dim2) * c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = wa[
			idij - 1] * c1[(i__ + (k + j * c1_dim3) * c1_dim2) *
			c1_dim1 + 1] - wa[idij] * c1[(i__ - 1 + (k + j *
			c1_dim3) * c1_dim2) * c1_dim1 + 1];
/* L108: */
	    }
/* L109: */
	}
/* L110: */
    }
L111:
    if (nbd < *l1) {
	goto L115;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1
			+ 1] + ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
		c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			- ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] +
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			;
		c1[(i__ + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
/* L112: */
	    }
/* L113: */
	}
/* L114: */
    }
    goto L121;
L115:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1
			+ 1] + ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
		c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			- ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] +
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			;
		c1[(i__ + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
/* L116: */
	    }
/* L117: */
	}
/* L118: */
    }
    goto L121;
L119:
    i__1 = *idl1;
    for (ik = 1; ik <= i__1; ++ik) {
	c2[(ik + c2_dim2) * c2_dim1 + 1] = ch2[(ik + ch2_dim2) * ch2_dim1 + 1]
		;
/* L120: */
    }
L121:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    c1[((k + j * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] = ch[((k + j *
		     ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] + ch[((k + jc *
		    ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
	    c1[((k + jc * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] = ch[((k +
		    jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] - ch[((k + j *
		     ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
/* L122: */
	}
/* L123: */
    }

    ar1 = 1.0;
    ai1 = 0.0;
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	ar1h = dcp * ar1 - dsp * ai1;
	ai1 = dcp * ai1 + dsp * ar1;
	ar1 = ar1h;
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    ch2[(ik + l * ch2_dim2) * ch2_dim1 + 1] = c2[(ik + c2_dim2) *
		    c2_dim1 + 1] + ar1 * c2[(ik + (c2_dim2 << 1)) * c2_dim1 +
		    1];
	    ch2[(ik + lc * ch2_dim2) * ch2_dim1 + 1] = ai1 * c2[(ik + *ip *
		    c2_dim2) * c2_dim1 + 1];
/* L124: */
	}
	dc2 = ar1;
	ds2 = ai1;
	ar2 = ar1;
	ai2 = ai1;
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    ar2h = dc2 * ar2 - ds2 * ai2;
	    ai2 = dc2 * ai2 + ds2 * ar2;
	    ar2 = ar2h;
	    i__3 = *idl1;
	    for (ik = 1; ik <= i__3; ++ik) {
		ch2[(ik + l * ch2_dim2) * ch2_dim1 + 1] += ar2 * c2[(ik + j *
			c2_dim2) * c2_dim1 + 1];
		ch2[(ik + lc * ch2_dim2) * ch2_dim1 + 1] += ai2 * c2[(ik + jc
			* c2_dim2) * c2_dim1 + 1];
/* L125: */
	    }
/* L126: */
	}
/* L127: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    ch2[(ik + ch2_dim2) * ch2_dim1 + 1] += c2[(ik + j * c2_dim2) *
		    c2_dim1 + 1];
/* L128: */
	}
/* L129: */
    }

    if (*ido < *l1) {
	goto L132;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    cc[(i__ + (k * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(i__ +
		    (k + ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L130: */
	}
/* L131: */
    }
    goto L135;
L132:
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(i__ + (k * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(i__ +
		    (k + ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L133: */
	}
/* L134: */
    }
L135:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(*ido + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] = ch[(
		    (k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
	    cc[((j2 - 1 + k * cc_dim3) * cc_dim2 + 1) * cc_dim1 + 1] = ch[((k
		    + jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
/* L136: */
	}
/* L137: */
    }
    if (*ido == 1) {
	return 0;
    }
    if (nbd < *l1) {
	goto L141;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		ic = idp2 - i__;
		cc[(i__ - 1 + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			 = ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(ic - 1 + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			= ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] - ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(i__ + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			+ ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		cc[(ic + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
/* L138: */
	    }
/* L139: */
	}
/* L140: */
    }
    return 0;
L141:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		cc[(i__ - 1 + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			 = ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(ic - 1 + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			= ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] - ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(i__ + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			+ ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		cc[(ic + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
/* L142: */
	    }
/* L143: */
	}
/* L144: */
    }
    return 0;
}